

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O1

void __thiscall glslang::TPublicType::initQualifiers(TPublicType *this,bool global)

{
  undefined1 *puVar1;
  undefined3 in_register_00000031;
  
  (this->qualifier).semanticName = (char *)0x0;
  puVar1 = &(this->qualifier).field_0x8;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xf800001401ff0000;
  TQualifier::clearLayout(&this->qualifier);
  (this->qualifier).spirvStorageClass = -1;
  (this->qualifier).spirvDecorate = (TSpirvDecorate *)0x0;
  puVar1 = &(this->qualifier).field_0x8;
  *(ulong *)puVar1 = *(ulong *)puVar1 & 0xe3ffffe7fe00ffff;
  if (CONCAT31(in_register_00000031,global) != 0) {
    *(ulong *)&(this->qualifier).field_0x8 =
         (*(ulong *)&(this->qualifier).field_0x8 & 0xffffffffffffff80) + 1;
  }
  return;
}

Assistant:

void initQualifiers(bool global = false)
    {
        qualifier.clear();
        if (global)
            qualifier.storage = EvqGlobal;
    }